

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String __thiscall testing::internal::String::ShowWideCStringQuoted(String *this,wchar_t *wide_c_str)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  String SVar3;
  String local_20;
  size_t sVar2;
  
  if (wide_c_str == (wchar_t *)0x0) {
    pcVar1 = (char *)operator_new__(7);
    builtin_strncpy(pcVar1,"(null)",7);
    this->c_str_ = pcVar1;
    this->length_ = 6;
    sVar2 = extraout_RDX_00;
  }
  else {
    ShowWideCString(&local_20,wide_c_str);
    SVar3 = Format((char *)this,"L\"%s\"",local_20.c_str_);
    sVar2 = SVar3.length_;
    if (local_20.c_str_ != (char *)0x0) {
      operator_delete__(local_20.c_str_);
      sVar2 = extraout_RDX;
    }
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String String::ShowWideCStringQuoted(const wchar_t* wide_c_str) {
  if (wide_c_str == NULL) return String("(null)");

  return String::Format("L\"%s\"",
                        String::ShowWideCString(wide_c_str).c_str());
}